

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void fmt::v5::internal::
     parse_format_string<true,wchar_t,fmt::v5::internal::format_string_checker<wchar_t,fmt::v5::internal::error_handler,wchar_t[3],int>&>
               (basic_string_view<wchar_t> format_str,
               format_string_checker<wchar_t,_fmt::v5::internal::error_handler,_wchar_t[3],_int>
               *handler)

{
  bool bVar1;
  format_string_checker<wchar_t,_fmt::v5::internal::error_handler,_wchar_t[3],_int> *this;
  size_t sVar2;
  undefined1 *puVar3;
  format_string_checker<wchar_t,_fmt::v5::internal::error_handler,_wchar_t[3],_int> *in_RDX;
  parse_context_type *ppVar4;
  wchar_t c;
  wchar_t *p;
  wchar_t *end;
  wchar_t *begin;
  writer write;
  undefined4 in_stack_ffffffffffffffa8;
  wchar_t in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb8;
  wchar_t in_stack_ffffffffffffffbc;
  format_string_checker<wchar_t,_fmt::v5::internal::error_handler,_wchar_t[3],_int>
  *in_stack_ffffffffffffffc0;
  format_string_checker<wchar_t,_fmt::v5::internal::error_handler,_wchar_t[3],_int> *pfVar5;
  format_string_checker<wchar_t,_fmt::v5::internal::error_handler,_wchar_t[3],_int> *local_38;
  format_string_checker<wchar_t,_fmt::v5::internal::error_handler,_wchar_t[3],_int> *local_30;
  format_string_checker<wchar_t,_fmt::v5::internal::error_handler,_wchar_t[3],_int> *handler_00;
  format_string_checker<wchar_t,_fmt::v5::internal::error_handler,_wchar_t[3],_int> *pfVar6;
  basic_string_view<wchar_t> local_10;
  
  pfVar6 = in_RDX;
  this = (format_string_checker<wchar_t,_fmt::v5::internal::error_handler,_wchar_t[3],_int> *)
         basic_string_view<wchar_t>::data(&local_10);
  pfVar5 = this;
  sVar2 = basic_string_view<wchar_t>::size(&local_10);
  local_30 = (format_string_checker<wchar_t,_fmt::v5::internal::error_handler,_wchar_t[3],_int> *)
             ((long)this->parse_funcs_ + sVar2 * 4 + -0x20);
  local_38 = pfVar5;
  do {
    if (local_38 == local_30) {
      return;
    }
    pfVar5 = in_stack_ffffffffffffffc0;
    handler_00 = local_38;
    if ((local_38->arg_id_ != 0x7b) &&
       (bVar1 = find<true,char,wchar_t_const*>
                          ((wchar_t *)local_38,(wchar_t *)local_30,'{',(wchar_t **)&local_38),
       pfVar5 = in_stack_ffffffffffffffc0, !bVar1)) {
      parse_format_string<true,_wchar_t,_fmt::v5::internal::format_string_checker<wchar_t,_fmt::v5::internal::error_handler,_wchar_t[3],_int>_&>
      ::writer::operator()
                ((writer *)in_stack_ffffffffffffffc0,
                 (wchar_t *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                 (wchar_t *)this);
      return;
    }
    in_stack_ffffffffffffffc0 = pfVar6;
    parse_format_string<true,_wchar_t,_fmt::v5::internal::format_string_checker<wchar_t,_fmt::v5::internal::error_handler,_wchar_t[3],_int>_&>
    ::writer::operator()
              ((writer *)pfVar5,
               (wchar_t *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
               (wchar_t *)this);
    puVar3 = &local_38->field_0x4;
    if ((format_string_checker<wchar_t,_fmt::v5::internal::error_handler,_wchar_t[3],_int> *)puVar3
        == local_30) {
      local_38 = (format_string_checker<wchar_t,_fmt::v5::internal::error_handler,_wchar_t[3],_int>
                  *)puVar3;
      format_string_checker<wchar_t,_fmt::v5::internal::error_handler,_wchar_t[3],_int>::on_error
                (this,(char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      return;
    }
    if ((char)*(undefined4 *)puVar3 == '}') {
      local_38 = (format_string_checker<wchar_t,_fmt::v5::internal::error_handler,_wchar_t[3],_int>
                  *)puVar3;
      format_string_checker<wchar_t,_fmt::v5::internal::error_handler,_wchar_t[3],_int>::on_arg_id
                (this);
      pfVar6 = in_stack_ffffffffffffffc0;
      format_string_checker<wchar_t,_fmt::v5::internal::error_handler,_wchar_t[3],_int>::
      on_replacement_field(in_stack_ffffffffffffffc0,(wchar_t *)local_38);
      in_stack_ffffffffffffffc0 = pfVar5;
    }
    else {
      pfVar6 = in_stack_ffffffffffffffc0;
      if (*(int *)puVar3 == 0x7b) {
        ppVar4 = &local_38->context_;
        local_38 = (format_string_checker<wchar_t,_fmt::v5::internal::error_handler,_wchar_t[3],_int>
                    *)puVar3;
        format_string_checker<wchar_t,_fmt::v5::internal::error_handler,_wchar_t[3],_int>::on_text
                  (in_stack_ffffffffffffffc0,(wchar_t *)puVar3,(wchar_t *)ppVar4);
        in_stack_ffffffffffffffc0 = pfVar5;
      }
      else {
        local_38 = (format_string_checker<wchar_t,_fmt::v5::internal::error_handler,_wchar_t[3],_int>
                    *)puVar3;
        local_38 = (format_string_checker<wchar_t,_fmt::v5::internal::error_handler,_wchar_t[3],_int>
                    *)parse_arg_id<wchar_t,fmt::v5::internal::id_adapter<fmt::v5::internal::format_string_checker<wchar_t,fmt::v5::internal::error_handler,wchar_t[3],int>&,wchar_t>>
                                ((wchar_t *)in_stack_ffffffffffffffc0,(wchar_t *)in_RDX,
                                 (id_adapter<fmt::v5::internal::format_string_checker<wchar_t,_fmt::v5::internal::error_handler,_wchar_t[3],_int>_&,_wchar_t>
                                  *)handler_00);
        if (local_38 == local_30) {
          in_stack_ffffffffffffffac = L'\0';
        }
        else {
          in_stack_ffffffffffffffac = local_38->arg_id_;
        }
        in_stack_ffffffffffffffbc = in_stack_ffffffffffffffac;
        if (in_stack_ffffffffffffffac == L'}') {
          format_string_checker<wchar_t,_fmt::v5::internal::error_handler,_wchar_t[3],_int>::
          on_replacement_field(pfVar6,(wchar_t *)local_38);
        }
        else {
          if (in_stack_ffffffffffffffac != L':') {
            format_string_checker<wchar_t,_fmt::v5::internal::error_handler,_wchar_t[3],_int>::
            on_error(this,(char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
            return;
          }
          local_38 = (format_string_checker<wchar_t,_fmt::v5::internal::error_handler,_wchar_t[3],_int>
                      *)format_string_checker<wchar_t,_fmt::v5::internal::error_handler,_wchar_t[3],_int>
                        ::on_format_specs(in_stack_ffffffffffffffc0,
                                          (wchar_t *)CONCAT44(0x3a,in_stack_ffffffffffffffb8),
                                          (wchar_t *)this);
          if ((local_38 == local_30) || (local_38->arg_id_ != L'}')) {
            format_string_checker<wchar_t,_fmt::v5::internal::error_handler,_wchar_t[3],_int>::
            on_error(this,(char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
            return;
          }
        }
      }
    }
    local_38 = (format_string_checker<wchar_t,_fmt::v5::internal::error_handler,_wchar_t[3],_int> *)
               &local_38->field_0x4;
  } while( true );
}

Assistant:

FMT_CONSTEXPR void parse_format_string(
        basic_string_view<Char> format_str, Handler &&handler) {
  struct writer {
    FMT_CONSTEXPR void operator()(const Char *begin, const Char *end) {
      if (begin == end) return;
      for (;;) {
        const Char *p = FMT_NULL;
        if (!find<IS_CONSTEXPR>(begin, end, '}', p))
          return handler_.on_text(begin, end);
        ++p;
        if (p == end || *p != '}')
          return handler_.on_error("unmatched '}' in format string");
        handler_.on_text(begin, p);
        begin = p + 1;
      }
    }
    Handler &handler_;
  } write{handler};
  auto begin = format_str.data();
  auto end = begin + format_str.size();
  while (begin != end) {
    // Doing two passes with memchr (one for '{' and another for '}') is up to
    // 2.5x faster than the naive one-pass implementation on big format strings.
    const Char *p = begin;
    if (*begin != '{' && !find<IS_CONSTEXPR>(begin, end, '{', p))
      return write(begin, end);
    write(begin, p);
    ++p;
    if (p == end)
      return handler.on_error("invalid format string");
    if (static_cast<char>(*p) == '}') {
      handler.on_arg_id();
      handler.on_replacement_field(p);
    } else if (*p == '{') {
      handler.on_text(p, p + 1);
    } else {
      p = parse_arg_id(p, end, id_adapter<Handler, Char>{handler});
      Char c = p != end ? *p : Char();
      if (c == '}') {
        handler.on_replacement_field(p);
      } else if (c == ':') {
        p = handler.on_format_specs(p + 1, end);
        if (p == end || *p != '}')
          return handler.on_error("unknown format specifier");
      } else {
        return handler.on_error("missing '}' in format string");
      }
    }
    begin = p + 1;
  }
}